

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line_interface_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::anon_unknown_0::CommandLineInterfaceTest_DisallowServicesHasService_Test
::TestBody(CommandLineInterfaceTest_DisallowServicesHasService_Test *this)

{
  string_view local_78 [2];
  allocator<char> local_51;
  string local_50;
  string_view local_30;
  string_view local_20;
  CommandLineInterfaceTest_DisallowServicesHasService_Test *local_10;
  CommandLineInterfaceTest_DisallowServicesHasService_Test *this_local;
  
  local_10 = this;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_20,"foo.proto");
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_30,"syntax = \"proto2\";\nmessage Foo {}\nservice Bar {}\n");
  CommandLineInterfaceTester::CreateTempFile((CommandLineInterfaceTester *)this,local_20,local_30);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,
             "protocol_compiler --disallow_services --test_out=$tmpdir --proto_path=$tmpdir foo.proto"
             ,&local_51);
  CommandLineInterfaceTest::Run(&this->super_CommandLineInterfaceTest,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::allocator<char>::~allocator(&local_51);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (local_78,"foo.proto: This file contains services");
  CommandLineInterfaceTester::ExpectErrorSubstring((CommandLineInterfaceTester *)this,local_78[0]);
  return;
}

Assistant:

TEST_F(CommandLineInterfaceTest, DisallowServicesHasService) {
  // Test that --disallow_services produces an error when there are services.

  CreateTempFile("foo.proto",
                 "syntax = \"proto2\";\n"
                 "message Foo {}\n"
                 "service Bar {}\n");

  Run("protocol_compiler --disallow_services --test_out=$tmpdir "
      "--proto_path=$tmpdir foo.proto");

  ExpectErrorSubstring("foo.proto: This file contains services");
}